

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5RowidCmp(Fts5Expr *pExpr,i64 iLhs,i64 iRhs)

{
  bool bVar1;
  
  if (pExpr->bDesc == 0) {
    if (iLhs < iRhs) {
      return -1;
    }
    bVar1 = iRhs < iLhs;
  }
  else {
    if (iRhs < iLhs) {
      return -1;
    }
    bVar1 = iLhs < iRhs;
  }
  return (int)bVar1;
}

Assistant:

static int fts5RowidCmp(
  Fts5Expr *pExpr,
  i64 iLhs,
  i64 iRhs
){
  assert( pExpr->bDesc==0 || pExpr->bDesc==1 );
  if( pExpr->bDesc==0 ){
    if( iLhs<iRhs ) return -1;
    return (iLhs > iRhs);
  }else{
    if( iLhs>iRhs ) return -1;
    return (iLhs < iRhs);
  }
}